

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O1

shared_ptr<slang::syntax::SyntaxTree>
slang::syntax::SyntaxTree::create
          (SourceManager *sourceManager,
          span<const_slang::SourceBuffer,_18446744073709551615UL> sources,Bag *options,
          MacroList inheritedMacros,bool guess)

{
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> inheritedMacros_00
  ;
  bool bVar1;
  SyntaxTree *pSVar2;
  ParserMetadata *metadata;
  invalid_argument *piVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SourceLibrary *library;
  size_t sVar4;
  shared_ptr<slang::syntax::SyntaxTree> sVar5;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources_00;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  MacroList inheritedMacros_01;
  string_view name;
  undefined7 in_stack_00000009;
  __extent_storage<18446744073709551615UL> in_stack_00000010;
  TimeTraceScope timeScope;
  BumpAllocator alloc;
  Diagnostics diagnostics;
  Preprocessor preprocessor;
  Parser parser;
  TimeTraceScope local_8ba;
  allocator<std::pair<const_std::type_index,_std::any>_> local_8b9;
  __extent_storage<18446744073709551615UL> local_8b8;
  Bag *local_8b0;
  element_type *local_8a8;
  CompilationUnitSyntax *local_8a0;
  SyntaxTree *local_898;
  BumpAllocator local_890;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  local_880;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_868;
  Diagnostics local_838;
  Preprocessor local_740;
  Parser local_3a8;
  
  inheritedMacros_01._M_ptr =
       (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
        *)inheritedMacros._M_ptr;
  local_8b8 = sources._M_extent._M_extent_value;
  pSVar2 = (SyntaxTree *)sources._M_ptr;
  local_8b0 = options;
  local_8a8 = (element_type *)sourceManager;
  if (options == (Bag *)0x0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"sources cannot be empty");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_740.sourceManager = (SourceManager *)&local_8b8;
  local_740.alloc = (BumpAllocator *)pSVar2;
  if (TimeTrace::profiler != 0) {
    detail.callable = (intptr_t)&local_740;
    detail.callback =
         function_ref<std::__cxx11::string()>::
         callback_fn<slang::syntax::SyntaxTree::create(slang::SourceManager&,std::span<slang::SourceBuffer_const,18446744073709551615ul>,slang::Bag_const&,std::span<slang::syntax::DefineDirectiveSyntax_const*const,18446744073709551615ul>,bool)::__0>
    ;
    name._M_str = "parseFile";
    name._M_len = 9;
    TimeTrace::beginTrace(name,detail);
  }
  BumpAllocator::BumpAllocator(&local_890);
  local_838.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_
       = (pointer)local_838.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_838.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len =
       0;
  local_838.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap =
       2;
  inheritedMacros_00._M_ptr._1_7_ = in_stack_00000009;
  inheritedMacros_00._M_ptr._0_1_ = guess;
  inheritedMacros_00._M_extent._M_extent_value = in_stack_00000010._M_extent_value;
  parsing::Preprocessor::Preprocessor
            (&local_740,(SourceManager *)pSVar2,&local_890,&local_838,
             (Bag *)inheritedMacros_01._M_ptr,inheritedMacros_00);
  local_898 = pSVar2;
  if (local_8b0 == (Bag *)0x0) {
    library = (SourceLibrary *)0x0;
  }
  else {
    sVar4 = (long)local_8b0 * 0x20 + local_8b8._M_extent_value;
    library = (SourceLibrary *)0x0;
    do {
      parsing::Preprocessor::pushSource(&local_740,*(SourceBuffer *)(sVar4 - 0x20));
      if ((sVar4 != (long)local_8b0 * 0x20 + local_8b8._M_extent_value) &&
         (library != *(SourceLibrary **)(sVar4 - 0x10))) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar3,
                   "All sources provided to a single SyntaxTree must be from the same source library"
                  );
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      library = *(SourceLibrary **)(sVar4 - 0x10);
      sVar4 = sVar4 - 0x20;
    } while (sVar4 != local_8b8._M_extent_value);
  }
  parsing::Parser::Parser(&local_3a8,&local_740,(Bag *)inheritedMacros_01._M_ptr);
  if ((char)inheritedMacros._M_extent._M_extent_value == '\0') {
    local_8a0 = parsing::Parser::parseCompilationUnit(&local_3a8);
  }
  else {
    local_8a0 = (CompilationUnitSyntax *)parsing::Parser::parseGuess(&local_3a8);
    bVar1 = parsing::Parser::isDone(&local_3a8);
    if (!bVar1) {
      sources_00._M_extent._M_extent_value = local_8b8._M_extent_value;
      sources_00._M_ptr = (pointer)local_898;
      inheritedMacros_01._M_extent._M_extent_value = 0;
      pSVar2 = local_898;
      create((SourceManager *)local_8a8,sources_00,local_8b0,inheritedMacros_01,guess);
      goto LAB_001d769b;
    }
  }
  pSVar2 = (SyntaxTree *)operator_new(0x178);
  metadata = parsing::Parser::getMetadata(&local_3a8);
  parsing::Preprocessor::getDefinedMacros(&local_880,&local_740);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::table_core(&local_868,inheritedMacros_01._M_ptr,&local_8b9);
  SyntaxTree(pSVar2,&local_8a0->super_SyntaxNode,library,(SourceManager *)local_898,&local_890,
             &local_838,metadata,&local_880,(Bag *)&local_868);
  *(SyntaxTree **)local_8a8 = pSVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<slang::syntax::SyntaxTree*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_8a8->rootNode,pSVar2);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_868);
  if (local_880.
      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    pSVar2 = (SyntaxTree *)
             ((long)local_880.
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_880.
                   super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_880.
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,(size_t)pSVar2);
  }
LAB_001d769b:
  parsing::Parser::~Parser(&local_3a8);
  parsing::Preprocessor::~Preprocessor(&local_740);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_838,(EVP_PKEY_CTX *)pSVar2);
  BumpAllocator::~BumpAllocator(&local_890);
  TimeTraceScope::~TimeTraceScope(&local_8ba);
  sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_8a8
  ;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::create(SourceManager& sourceManager,
                                               std::span<const SourceBuffer> sources,
                                               const Bag& options, MacroList inheritedMacros,
                                               bool guess) {
    if (sources.empty())
        SLANG_THROW(std::invalid_argument("sources cannot be empty"));

    TimeTraceScope timeScope("parseFile"sv, [&] {
        if (sources.size() == 1)
            return std::string(sourceManager.getRawFileName(sources[0].id));
        else
            return "<multi-buffer>"s;
    });

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, options, inheritedMacros);

    const SourceLibrary* library = nullptr;
    for (auto it = sources.rbegin(); it != sources.rend(); it++) {
        preprocessor.pushSource(*it);

        if (it != sources.rbegin() && library != it->library) {
            SLANG_THROW(std::invalid_argument("All sources provided to a single SyntaxTree must be "
                                              "from the same source library"));
        }

        library = it->library;
    }

    Parser parser(preprocessor, options);

    SyntaxNode* root;
    if (!guess)
        root = &parser.parseCompilationUnit();
    else {
        root = &parser.parseGuess();
        if (!parser.isDone())
            return create(sourceManager, sources, options, inheritedMacros, false);
    }

    return std::shared_ptr<SyntaxTree>(
        new SyntaxTree(root, library, sourceManager, std::move(alloc), std::move(diagnostics),
                       parser.getMetadata(), preprocessor.getDefinedMacros(), options));
}